

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

shared_ptr<const_void> __thiscall
pstore::database::get(database *this,address addr,size_t size,bool initialized,bool writable)

{
  long lVar1;
  undefined7 in_register_00000009;
  size_t size_00;
  bool in_R9B;
  shared_ptr<const_void> sVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  size_00 = CONCAT71(in_register_00000009,initialized);
  check_get_params((database *)addr.a_,(address)size,size_00,in_R9B);
  if (size_00 != 0) {
    if (size_00 + size == 0) {
      assert_failed("lhs.absolute () >= rhs",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/address.hpp"
                    ,0xca);
    }
    lVar1 = *(long *)(addr.a_ + 8);
    if (*(long *)(lVar1 + 0x10 + (ulong)(((uint)(size >> 0x16) & 0xffff) << 5)) !=
        *(long *)(lVar1 + 0x10 + (ulong)(((uint)((size_00 + size) - 1 >> 0x16) & 0xffff) << 5))) {
      sVar3 = get_spanning(this,addr,size,initialized,writable);
      _Var2 = sVar3.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      goto LAB_0015e14c;
    }
  }
  sVar3 = storage::address_to_pointer((storage *)this,(address)(addr.a_ + 8));
  _Var2 = sVar3.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
LAB_0015e14c:
  sVar3.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<const_void>)sVar3.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto database::get (address const addr, std::size_t const size, bool const initialized,
                        bool const writable) const -> std::shared_ptr<void const> {
        this->check_get_params (addr, size, writable);
        if (storage_.request_spans_regions (addr, size)) {
            return this->get_spanning (addr, size, initialized, writable);
        }
        return storage_.address_to_pointer (addr);
    }